

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_class.cpp
# Opt level: O3

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseClass
          (Parser *this,
          unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *caps)

{
  Token *tokId;
  _List_node_base *p_Var1;
  pointer puVar2;
  __uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true> _Var3;
  Lexer *lexer;
  _List_node_base *p_Var4;
  __uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true> _Var5;
  bool bVar6;
  Lexer *this_00;
  unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *in_RDX;
  bool *err_00;
  pointer __p;
  bool err;
  list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
  constructAttributes;
  vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  local_98;
  list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
  attrs;
  __uniq_ptr_impl<pfederc::ClassExpr,_std::default_delete<pfederc::ClassExpr>_> local_60 [3];
  list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
  functions;
  
  sanityExpect((Parser *)caps,TOK_KW_CLASS);
  bVar6 = Token::operator==(*(Token **)
                             ((long)&(caps->_M_t).
                                     super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                                     .super__Head_base<0UL,_pfederc::Capabilities_*,_false>.
                                     _M_head_impl[3].required.
                                     super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                             + 8),TOK_KW_TRAIT);
  if (bVar6) {
    parseClassTrait(this,caps);
  }
  else {
    err = false;
    local_98.
    super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.
    super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.
    super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar6 = Token::operator==(*(Token **)
                               ((long)&(caps->_M_t).
                                       super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                                       .super__Head_base<0UL,_pfederc::Capabilities_*,_false>.
                                       _M_head_impl[3].required.
                                       super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                               + 8),TOK_OP_TEMPL_BRACKET_OPEN);
    if (bVar6) {
      parseTemplateDecl((TemplateDecls *)&attrs,(Parser *)caps);
      local_98.
      super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)attrs.
                    super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next;
      local_98.
      super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)attrs.
                    super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
                    ._M_impl._M_node.super__List_node_base._M_prev;
      local_98.
      super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)attrs.
                    super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
                    ._M_impl._M_node._M_size;
      constructAttributes.
      super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
      constructAttributes.
      super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
      constructAttributes.
      super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
      ._M_impl._M_node._M_size = 0;
      attrs.
      super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
      attrs.
      super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
      attrs.
      super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
      ._M_impl._M_node._M_size = 0;
      std::
      vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
      ::~vector((vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
                 *)&constructAttributes);
      std::
      vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
      ::~vector((vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
                 *)&attrs);
      err = true;
    }
    tokId = *(Token **)
             ((long)&(caps->_M_t).
                     super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                     .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl[3].required
                     .
                     super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
             + 8);
    bVar6 = expect((Parser *)caps,TOK_ID);
    if (!bVar6) {
      constructAttributes.
      super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)operator_new(0x38);
      p_Var1 = (_List_node_base *)(tokId->pos).endIndex;
      *(undefined2 *)
       &(constructAttributes.
         super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
         ._M_impl._M_node.super__List_node_base._M_next)->_M_next = 2;
      *(undefined4 *)
       ((long)&(constructAttributes.
                super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next)->_M_next + 4) = 8;
      p_Var4 = (_List_node_base *)(tokId->pos).startIndex;
      (constructAttributes.
       super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next)->_M_prev =
           (_List_node_base *)(tokId->pos).line;
      constructAttributes.
      super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next[1]._M_next = p_Var4;
      constructAttributes.
      super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next[1]._M_prev = p_Var1;
      constructAttributes.
      super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next[2]._M_next = (_List_node_base *)0x0;
      constructAttributes.
      super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next[2]._M_prev = (_List_node_base *)0x0;
      constructAttributes.
      super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next[3]._M_next = (_List_node_base *)0x0;
      generateError((Parser *)(local_60 + 2),
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)caps);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 (local_60 + 2));
      if (constructAttributes.
          super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
          ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)0x0) {
        std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                  ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&constructAttributes
                   ,(Error<pfederc::SyntaxErrorCode> *)
                    constructAttributes.
                    super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next);
      }
      err = true;
    }
    constructAttributes.
    super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&constructAttributes;
    constructAttributes.
    super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
    ._M_impl._M_node._M_size = 0;
    err_00 = (bool *)0x2f;
    constructAttributes.
    super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev =
         constructAttributes.
         super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    bVar6 = Token::operator==(*(Token **)
                               ((long)&(caps->_M_t).
                                       super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                                       .super__Head_base<0UL,_pfederc::Capabilities_*,_false>.
                                       _M_head_impl[3].required.
                                       super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                               + 8),TOK_OP_BRACKET_OPEN);
    if (bVar6) {
      parseClassConstructor((Parser *)caps,err_00,&constructAttributes);
    }
    bVar6 = expect((Parser *)caps,TOK_EOL);
    if (!bVar6) {
      puVar2 = *(pointer *)
                ((long)&(caps->_M_t).
                        super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                        .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl[3].
                        required.
                        super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                + 8);
      attrs.
      super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)operator_new(0x38);
      _Var3.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
      super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
      super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
           puVar2[5]._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>;
      *(undefined2 *)
       &(attrs.
         super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
         ._M_impl._M_node.super__List_node_base._M_next)->_M_next = 2;
      *(undefined4 *)
       ((long)&(attrs.
                super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next)->_M_next + 4) = 0xf;
      _Var5.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
      super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
      super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
           puVar2[4]._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>;
      (attrs.
       super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next)->_M_prev =
           (_List_node_base *)
           puVar2[3]._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>;
      attrs.
      super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next[1]._M_next =
           (_List_node_base *)
           _Var5.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
           super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
           super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
      attrs.
      super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next[1]._M_prev =
           (_List_node_base *)
           _Var3.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
           super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
           super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
      attrs.
      super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next[2]._M_next = (_List_node_base *)0x0;
      attrs.
      super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next[2]._M_prev = (_List_node_base *)0x0;
      attrs.
      super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next[3]._M_next = (_List_node_base *)0x0;
      generateError((Parser *)(local_60 + 1),
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)caps);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 (local_60 + 1));
      if (attrs.
          super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
          ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)0x0) {
        std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                  ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&attrs,
                   (Error<pfederc::SyntaxErrorCode> *)
                   attrs.
                   super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
                   ._M_impl._M_node.super__List_node_base._M_next);
      }
    }
    attrs.
    super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
    ._M_impl._M_node._M_size = 0;
    functions.
    super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
    ._M_impl._M_node._M_size = 0;
    attrs.
    super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&attrs;
    attrs.
    super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&attrs;
    functions.
    super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&functions;
    functions.
    super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&functions;
    parseClassBody((Parser *)caps,tokId,&err,&attrs,&functions);
    lexer = (Lexer *)(caps->_M_t).
                     super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                     .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl;
    this_00 = (Lexer *)operator_new(0xa8);
    ClassExpr::ClassExpr
              ((ClassExpr *)this_00,lexer,&tokId->pos,in_RDX,tokId,&local_98,
               (list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
                *)&constructAttributes.
                   super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
               ,&attrs,&functions);
    local_60[0]._M_t.
    super__Tuple_impl<0UL,_pfederc::ClassExpr_*,_std::default_delete<pfederc::ClassExpr>_>.
    super__Head_base<0UL,_pfederc::ClassExpr_*,_false>._M_head_impl =
         (tuple<pfederc::ClassExpr_*,_std::default_delete<pfederc::ClassExpr>_>)
         (_Tuple_impl<0UL,_pfederc::ClassExpr_*,_std::default_delete<pfederc::ClassExpr>_>)0x0;
    this->lexer = this_00;
    std::unique_ptr<pfederc::ClassExpr,_std::default_delete<pfederc::ClassExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ClassExpr,_std::default_delete<pfederc::ClassExpr>_> *)local_60)
    ;
    std::__cxx11::
    _List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
    ::_M_clear((_List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
                *)&functions);
    std::__cxx11::
    _List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
    ::_M_clear((_List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
                *)&attrs);
    std::__cxx11::
    _List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
    ::_M_clear(&constructAttributes.
                super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
              );
    std::
    vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
    ::~vector(&local_98);
  }
  return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseClass(std::unique_ptr<Capabilities> &&caps) noexcept {
  sanityExpect(TokenType::TOK_KW_CLASS);
  // maybe it's a class trait
  if (*lexer.getCurrentToken() == TokenType::TOK_KW_TRAIT)
    return parseClassTrait(std::move(caps));

  bool err = false;

  // class templ?
  TemplateDecls templ;
  if (*lexer.getCurrentToken() == TokenType::TOK_OP_TEMPL_BRACKET_OPEN) {
    templ = parseTemplateDecl();
    err = true;
  }

  // class templ? id
  const Token *const tokId = lexer.getCurrentToken();
  if (!expect(TokenType::TOK_ID)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_ID, tokId->getPosition()));
    err = true;
  }

  std::list<std::unique_ptr<BiOpExpr>> constructAttributes;
  // class templ? id constructor?
  if (*lexer.getCurrentToken() == TokenType::TOK_OP_BRACKET_OPEN) {
    parseClassConstructor(err, constructAttributes);
  }
  // class templ? id constructor? newline
  if (!expect(TokenType::TOK_EOL)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_EOL, lexer.getCurrentToken()->getPosition()));
  }

  std::list<std::unique_ptr<BiOpExpr>> attrs;
  std::list<std::unique_ptr<FuncExpr>> functions;
	parseClassBody(tokId, err, attrs, functions);

  return std::make_unique<ClassExpr>(lexer, tokId->getPosition(), std::move(caps),
    tokId, std::move(templ), std::move(constructAttributes),
    std::move(attrs), std::move(functions));
}